

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * __thiscall
el::base::utils::OS::getEnvironmentVariable_abi_cxx11_
          (string *__return_storage_ptr__,OS *this,char *variableName,char *defaultVal,
          char *alternativeBashCommand)

{
  char *pcVar1;
  int iVar2;
  allocator local_45 [20];
  allocator local_31;
  char *local_30;
  char *val;
  char *alternativeBashCommand_local;
  char *defaultVal_local;
  char *variableName_local;
  
  val = defaultVal;
  alternativeBashCommand_local = variableName;
  defaultVal_local = (char *)this;
  variableName_local = (char *)__return_storage_ptr__;
  local_30 = getenv((char *)this);
  if ((local_30 != (char *)0x0) && (iVar2 = strcmp(local_30,""), pcVar1 = local_30, iVar2 != 0)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,local_45);
    ::std::allocator<char>::~allocator((allocator<char> *)local_45);
    return __return_storage_ptr__;
  }
  pcVar1 = alternativeBashCommand_local;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_31);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return __return_storage_ptr__;
}

Assistant:

std::string OS::getEnvironmentVariable(const char* variableName, const char* defaultVal,
                                       const char* alternativeBashCommand) {
#if ELPP_OS_UNIX
  const char* val = getenv(variableName);
#elif ELPP_OS_WINDOWS
  const char* val = getWindowsEnvironmentVariable(variableName);
#endif  // ELPP_OS_UNIX
  if ((val == nullptr) || ((strcmp(val, "") == 0))) {
#if ELPP_OS_UNIX && defined(ELPP_FORCE_ENV_VAR_FROM_BASH)
    // Try harder on unix-based systems
    std::string valBash = base::utils::OS::getBashOutput(alternativeBashCommand);
    if (valBash.empty()) {
      return std::string(defaultVal);
    } else {
      return valBash;
    }
#elif ELPP_OS_WINDOWS || ELPP_OS_UNIX
    ELPP_UNUSED(alternativeBashCommand);
    return std::string(defaultVal);
#endif  // ELPP_OS_UNIX && defined(ELPP_FORCE_ENV_VAR_FROM_BASH)
  }
  return std::string(val);
}